

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int readline(char *line,int line_size,FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  size_t len;
  FILE *fp_local;
  int line_size_local;
  char *line_local;
  
  if (line == (char *)0x0) {
    line_local._4_4_ = -1;
  }
  else {
    pcVar1 = fgets(line,line_size,(FILE *)fp);
    if (pcVar1 == (char *)0x0) {
      line_local._4_4_ = -1;
    }
    else {
      if (((*line != '\0') && (sVar2 = strlen(line), sVar2 != 0)) && (line[sVar2 - 1] == '\n')) {
        line[sVar2 - 1] = '\0';
      }
      if (((*line != '\0') && (sVar2 = strlen(line), sVar2 != 0)) && (line[sVar2 - 1] == '\r')) {
        line[sVar2 - 1] = '\0';
      }
      line_local._4_4_ = 0;
    }
  }
  return line_local._4_4_;
}

Assistant:

static int
readline(char *line, int line_size, FILE * fp)
{
    size_t len;

    if(!line) {
        return -1;
    }
    if(!fgets(line, line_size, fp)) {
        return -1;
    }

    if(*line) {
        len = strlen(line);
        if(len > 0 && line[len - 1] == '\n') {
            line[len - 1] = '\0';
        }
    }

    if(*line) {
        len = strlen(line);
        if(len > 0 && line[len - 1] == '\r') {
            line[len - 1] = '\0';
        }
    }

    return 0;
}